

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall testing::Matcher<bool>::Matcher(Matcher<bool> *this,bool value)

{
  MatcherBase<bool> local_28;
  
  (this->super_MatcherBase<bool>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<bool>).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bbe78;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<bool>::
       GetVTable<testing::internal::MatcherBase<bool>::ValuePolicy<testing::internal::EqMatcher<bool>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bbe78;
  local_28.buffer_.i._0_1_ = value;
  internal::MatcherBase<bool>::operator=(&this->super_MatcherBase<bool>,&local_28);
  internal::MatcherBase<bool>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }